

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

bool __thiscall amrex::BoxArray::CellEqual(BoxArray *this,BoxArray *rhs)

{
  bool bVar1;
  IntVect IVar2;
  shared_ptr<amrex::BARef> *in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  bool bVar3;
  BoxArray *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar4;
  int local_88;
  undefined8 local_7c;
  int local_74;
  int local_70 [3];
  undefined8 local_60;
  int local_58;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  IVar2 = crseRatio(in_stack_ffffffffffffff60);
  local_70[2] = IVar2.vect[2];
  local_58 = local_70[2];
  local_70._0_8_ = IVar2.vect._0_8_;
  local_60._0_4_ = local_70[0];
  local_60._4_4_ = local_70[1];
  local_70 = IVar2.vect;
  IVar2 = crseRatio(in_stack_ffffffffffffff60);
  local_88 = IVar2.vect[2];
  local_74 = local_88;
  local_38 = &local_60;
  local_40 = &local_7c;
  local_c = 0;
  local_7c._0_4_ = IVar2.vect[0];
  uVar4 = false;
  if ((int)local_60 == (int)local_7c) {
    local_1c = 1;
    local_7c._4_4_ = IVar2.vect[1];
    uVar4 = false;
    local_18 = local_40;
    if (local_60._4_4_ == local_7c._4_4_) {
      local_2c = 2;
      uVar4 = local_58 == local_88;
      local_28 = local_40;
    }
  }
  bVar3 = false;
  if ((bool)uVar4 != false) {
    local_7c = IVar2.vect._0_8_;
    local_8 = local_40;
    bVar1 = std::operator==((shared_ptr<amrex::BARef> *)
                            (ulong)CONCAT16(in_stack_ffffffffffffff56,
                                            CONCAT15(in_stack_ffffffffffffff55,
                                                     in_stack_ffffffffffffff50)),
                            in_stack_ffffffffffffff48);
    bVar3 = true;
    if (!bVar1) {
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfb9ed1);
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfb9ee3);
      bVar3 = std::operator==(IVar2.vect._0_8_,
                              (vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff68));
    }
  }
  return bVar3;
}

Assistant:

bool
BoxArray::CellEqual (const BoxArray& rhs) const noexcept
{
    return crseRatio() == rhs.crseRatio()
        && (m_ref == rhs.m_ref || m_ref->m_abox == rhs.m_ref->m_abox);
}